

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

void refreshLine(linenoiseState *l)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  linenoiseState *l_00;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  char seq [64];
  abuf local_b0;
  char *local_a0;
  ulong local_98;
  linenoiseState *local_90;
  size_t local_88;
  size_t local_80;
  undefined8 local_78;
  undefined2 local_70;
  
  local_90 = l;
  if (mlmode == 0) {
    pcVar5 = l->prompt;
    local_80 = strlen(pcVar5);
    local_a0 = l->buf;
    sVar15 = l->len;
    local_98 = l->pos + local_80;
    uVar12 = l->cols;
    if (uVar12 <= local_98) {
      uVar8 = uVar12 - 1;
      if (local_98 - 1 < uVar12 - 1) {
        uVar8 = local_98 - 1;
      }
      local_a0 = local_a0 + (local_98 - uVar8);
      sVar15 = (sVar15 - local_98) + uVar8;
      local_98 = uVar8;
    }
    local_88 = CONCAT44(local_88._4_4_,l->ofd);
    uVar8 = sVar15 + local_80;
    if (uVar12 < sVar15 + local_80) {
      uVar8 = uVar12;
    }
    local_b0.b = (char *)0x0;
    local_b0.len = 0;
    local_78 = CONCAT62(local_78._2_6_,0xd);
    sVar4 = strlen((char *)&local_78);
    uVar10 = (uint)sVar4;
    pcVar6 = (char *)malloc((long)(int)uVar10);
    if (pcVar6 != (char *)0x0) {
      memcpy(pcVar6,&local_78,(long)(int)uVar10);
      local_b0.b = pcVar6;
      local_b0.len = uVar10;
    }
    sVar4 = strlen(pcVar5);
    lVar14 = (long)local_b0.len;
    sVar11 = (int)sVar4 + lVar14;
    pcVar6 = (char *)realloc(local_b0.b,sVar11);
    if (pcVar6 != (char *)0x0) {
      memcpy(pcVar6 + lVar14,pcVar5,(long)(int)sVar4);
      local_b0.len = (int)sVar11;
      local_b0.b = pcVar6;
    }
    sVar4 = local_80;
    if (maskmode == '\x01') {
      pcVar5 = local_b0.b;
      if (uVar8 - local_80 == 0) {
        uVar12 = (ulong)(uint)local_b0.len;
      }
      else {
        lVar14 = local_80 - uVar8;
        uVar10 = local_b0.len;
        do {
          pcVar6 = (char *)realloc(pcVar5,(long)(int)(uVar10 + 1));
          if (pcVar6 != (char *)0x0) {
            pcVar6[(int)uVar10] = '*';
            pcVar5 = pcVar6;
            uVar10 = uVar10 + 1;
          }
          uVar12 = (ulong)uVar10;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0);
      }
LAB_00103b25:
      local_b0.len = (int)uVar12;
      local_b0.b = pcVar5;
    }
    else {
      lVar14 = (long)local_b0.len;
      iVar13 = (int)(uVar8 - local_80);
      uVar12 = iVar13 + lVar14;
      pcVar5 = (char *)realloc(local_b0.b,uVar12);
      if (pcVar5 != (char *)0x0) {
        memcpy(pcVar5 + lVar14,local_a0,(long)iVar13);
        goto LAB_00103b25;
      }
    }
    refreshShowHints(&local_b0,local_90,(int)sVar4);
    uVar12 = (ulong)local_78 >> 0x20;
    local_78 = CONCAT44((uint)uVar12 & 0xffffff00,0x4b305b1b);
    sVar4 = strlen((char *)&local_78);
    lVar14 = (long)local_b0.len;
    sVar11 = (int)sVar4 + lVar14;
    pcVar5 = (char *)realloc(local_b0.b,sVar11);
    if (pcVar5 != (char *)0x0) {
      memcpy(pcVar5 + lVar14,&local_78,(long)(int)sVar4);
      local_b0.len = (int)sVar11;
      local_b0.b = pcVar5;
    }
    snprintf((char *)&local_78,0x40,"\r\x1b[%dC",local_98);
    sVar4 = strlen((char *)&local_78);
    lVar14 = (long)local_b0.len;
    sVar11 = (int)sVar4 + lVar14;
    pcVar5 = (char *)realloc(local_b0.b,sVar11);
    if (pcVar5 != (char *)0x0) {
      memcpy(pcVar5 + lVar14,&local_78,(long)(int)sVar4);
      local_b0.len = (int)sVar11;
      local_b0.b = pcVar5;
    }
    iVar13 = (int)local_88;
    goto LAB_00103c08;
  }
  local_88 = strlen(l->prompt);
  local_98 = (ulong)(int)local_88;
  uVar12 = l->cols;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (l->len + local_98 + uVar12) - 1;
  local_a0 = SUB168(auVar3 / auVar2,0);
  iVar13 = (int)l->maxrows;
  iVar7 = SUB164(auVar3 / auVar2,0);
  if (iVar13 < iVar7) {
    l->maxrows = (long)iVar7;
  }
  local_80 = CONCAT44(local_80._4_4_,l->ofd);
  local_b0.b = (char *)0x0;
  local_b0.len = 0;
  if ((int)((local_98 + uVar12 + l->oldpos) / uVar12) < iVar13) {
    snprintf((char *)&local_78,0x40,"\x1b[%dB");
    sVar4 = strlen((char *)&local_78);
    uVar10 = (uint)sVar4;
    pcVar5 = (char *)malloc((long)(int)uVar10);
    if (pcVar5 != (char *)0x0) {
      memcpy(pcVar5,&local_78,(long)(int)uVar10);
      local_b0.b = pcVar5;
      local_b0.len = uVar10;
    }
  }
  pcVar5 = local_b0.b;
  uVar10 = local_b0.len;
  if (1 < iVar13) {
    iVar13 = iVar13 + -1;
    do {
      local_78 = 0x315b1b4b305b1b0d;
      local_70 = 0x41;
      sVar4 = strlen((char *)&local_78);
      uVar9 = (int)sVar4 + uVar10;
      pcVar6 = (char *)realloc(pcVar5,(long)(int)uVar9);
      if (pcVar6 != (char *)0x0) {
        memcpy(pcVar6 + (int)uVar10,&local_78,(long)(int)sVar4);
        pcVar5 = pcVar6;
        uVar10 = uVar9;
      }
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  local_78 = CONCAT26(local_78._6_2_,0x4b305b1b0d);
  local_b0.b = pcVar5;
  local_b0.len = uVar10;
  sVar4 = strlen((char *)&local_78);
  uVar9 = (int)sVar4 + uVar10;
  pcVar5 = (char *)realloc(pcVar5,(long)(int)uVar9);
  if (pcVar5 != (char *)0x0) {
    memcpy(pcVar5 + (int)uVar10,&local_78,(long)(int)sVar4);
    local_b0.b = pcVar5;
    local_b0.len = uVar9;
  }
  pcVar5 = local_90->prompt;
  sVar4 = strlen(pcVar5);
  lVar14 = (long)local_b0.len;
  sVar11 = (int)sVar4 + lVar14;
  pcVar6 = (char *)realloc(local_b0.b,sVar11);
  if (pcVar6 != (char *)0x0) {
    memcpy(pcVar6 + lVar14,pcVar5,(long)(int)sVar4);
    local_b0.len = (int)sVar11;
    local_b0.b = pcVar6;
  }
  l_00 = local_90;
  if (maskmode == '\x01') {
    pcVar6 = local_b0.b;
    if (local_90->len == 0) {
      uVar12 = (ulong)(uint)local_b0.len;
    }
    else {
      uVar8 = 1;
      uVar10 = local_b0.len;
      do {
        pcVar5 = (char *)realloc(pcVar6,(long)(int)(uVar10 + 1));
        if (pcVar5 != (char *)0x0) {
          pcVar5[(int)uVar10] = '*';
          pcVar6 = pcVar5;
          uVar10 = uVar10 + 1;
        }
        uVar12 = (ulong)uVar10;
        bVar1 = uVar8 < l_00->len;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar1);
    }
LAB_00103916:
    local_b0.len = (int)uVar12;
    local_b0.b = pcVar6;
  }
  else {
    pcVar5 = local_90->buf;
    lVar14 = (long)local_b0.len;
    iVar13 = (int)local_90->len;
    uVar12 = iVar13 + lVar14;
    pcVar6 = (char *)realloc(local_b0.b,uVar12);
    if (pcVar6 != (char *)0x0) {
      memcpy(pcVar6 + lVar14,pcVar5,(long)iVar13);
      goto LAB_00103916;
    }
  }
  iVar13 = (int)local_88;
  refreshShowHints(&local_b0,l_00,iVar13);
  sVar15 = l_00->pos;
  iVar7 = (int)local_a0;
  if (((sVar15 != 0) && (sVar15 == l_00->len)) && ((sVar15 + local_98) % l_00->cols == 0)) {
    lVar14 = (long)local_b0.len;
    sVar4 = lVar14 + 1;
    pcVar5 = (char *)realloc(local_b0.b,sVar4);
    if (pcVar5 != (char *)0x0) {
      pcVar5[lVar14] = '\n';
      local_b0.len = (int)sVar4;
      local_b0.b = pcVar5;
    }
    local_78 = CONCAT62(local_78._2_6_,0xd);
    sVar4 = strlen((char *)&local_78);
    lVar14 = (long)local_b0.len;
    sVar11 = (int)sVar4 + lVar14;
    pcVar5 = (char *)realloc(local_b0.b,sVar11);
    if (pcVar5 != (char *)0x0) {
      memcpy(pcVar5 + lVar14,&local_78,(long)(int)sVar4);
      local_b0.len = (int)sVar11;
      local_b0.b = pcVar5;
    }
    iVar7 = (int)local_a0 + 1;
    iVar13 = (int)local_88;
    if ((int)l_00->maxrows <= (int)local_a0) {
      l_00->maxrows = (long)iVar7;
    }
  }
  if ((int)((local_98 + l_00->pos + l_00->cols) / l_00->cols) < iVar7) {
    snprintf((char *)&local_78,0x40,"\x1b[%dA");
    sVar4 = strlen((char *)&local_78);
    lVar14 = (long)local_b0.len;
    sVar11 = (int)sVar4 + lVar14;
    pcVar5 = (char *)realloc(local_b0.b,sVar11);
    if (pcVar5 != (char *)0x0) {
      memcpy(pcVar5 + lVar14,&local_78,(long)(int)sVar4);
      local_b0.len = (int)sVar11;
      local_b0.b = pcVar5;
    }
  }
  uVar12 = (long)(iVar13 + (int)local_90->pos) % (long)(int)local_90->cols;
  if ((int)uVar12 == 0) {
    local_78 = CONCAT62(local_78._2_6_,0xd);
  }
  else {
    snprintf((char *)&local_78,0x40,"\r\x1b[%dC",uVar12 & 0xffffffff);
  }
  sVar4 = strlen((char *)&local_78);
  lVar14 = (long)local_b0.len;
  sVar11 = (int)sVar4 + lVar14;
  pcVar5 = (char *)realloc(local_b0.b,sVar11);
  if (pcVar5 != (char *)0x0) {
    memcpy(pcVar5 + lVar14,&local_78,(long)(int)sVar4);
    local_b0.len = (int)sVar11;
    local_b0.b = pcVar5;
  }
  local_90->oldpos = local_90->pos;
  iVar13 = (int)local_80;
LAB_00103c08:
  pcVar5 = local_b0.b;
  write(iVar13,local_b0.b,(long)local_b0.len);
  free(pcVar5);
  return;
}

Assistant:

static void refreshLine(struct linenoiseState *l) {
    if (mlmode)
        refreshMultiLine(l);
    else
        refreshSingleLine(l);
}